

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.nalg.c
# Opt level: O0

void pnga_add(void *alpha,Integer g_a,void *beta,Integer g_b,Integer g_c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  logical lVar9;
  Integer IVar10;
  long proc;
  Integer in_RCX;
  double *in_RDX;
  Integer in_RSI;
  double *in_RDI;
  Integer in_R8;
  SingleComplex y_1;
  SingleComplex x_1;
  SingleComplex *ac_1;
  SingleComplex b_1;
  SingleComplex a_1;
  DoubleComplex y;
  DoubleComplex x;
  DoubleComplex *ac;
  DoubleComplex b;
  DoubleComplex a;
  int _i_2;
  int _i_1;
  int _i;
  Integer cdims [7];
  Integer cndim;
  Integer bdims [7];
  Integer bndim;
  Integer adims [7];
  Integer andim;
  Integer _hi [7];
  Integer _lo [7];
  Integer _ld [6];
  Integer _dims [7];
  int local_sync_end;
  int local_sync_begin;
  Integer c_grp;
  Integer b_grp;
  Integer a_grp;
  void *ptr_c;
  void *ptr_b;
  void *ptr_a;
  Integer i;
  Integer elemsa;
  Integer elemsb;
  Integer elems;
  Integer me;
  Integer typeC;
  Integer type;
  Integer ndim;
  Integer in_stack_000009c0;
  void *in_stack_000009c8;
  Integer *in_stack_000009d0;
  Integer *in_stack_000009d8;
  Integer in_stack_000009e0;
  void *in_stack_000009e8;
  Integer *in_stack_00000a00;
  Integer *in_stack_00000a08;
  Integer in_stack_00000a10;
  Integer *in_stack_00000a18;
  Integer *in_stack_00000a20;
  Integer in_stack_fffffffffffffc80;
  float local_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float local_338;
  float fStack_334;
  float local_330;
  float fStack_32c;
  int local_264;
  int local_260;
  int local_25c;
  Integer in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  Integer local_198 [4];
  Integer *in_stack_fffffffffffffe88;
  Integer *in_stack_fffffffffffffe90;
  Integer *in_stack_fffffffffffffe98;
  Integer in_stack_fffffffffffffea0;
  long local_158 [8];
  long local_118 [14];
  int local_a8;
  int local_a4;
  Integer local_a0;
  long local_98;
  Integer local_90;
  Integer *local_88;
  Integer *local_80;
  Integer *in_stack_ffffffffffffff88;
  Integer *hi;
  Integer *in_stack_ffffffffffffff90;
  long proc_00;
  long lVar11;
  long local_58;
  long local_48;
  long local_40;
  long local_38;
  
  local_58 = 0;
  lVar11 = 0;
  proc_00 = 0;
  local_a4 = _ga_sync_begin;
  local_a8 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  local_90 = pnga_get_pgroup(in_RSI);
  local_98 = pnga_get_pgroup(in_RCX);
  local_a0 = pnga_get_pgroup(in_R8);
  if ((local_90 != local_98) || (local_98 != local_a0)) {
    pnga_error(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  }
  if (local_a4 != 0) {
    pnga_pgroup_sync(in_stack_fffffffffffffc80);
  }
  pnga_pgroup_nodeid(local_90);
  lVar9 = pnga_compare_distr((Integer)a.real,(Integer)b.imag);
  if (((((lVar9 == 0) || (lVar9 = pnga_compare_distr((Integer)a.real,(Integer)b.imag), lVar9 == 0))
       || (lVar9 = pnga_has_ghosts(in_RSI), lVar9 != 0)) ||
      ((lVar9 = pnga_has_ghosts(in_RCX), lVar9 != 0 || (lVar9 = pnga_has_ghosts(in_R8), lVar9 != 0))
      )) || ((IVar10 = pnga_total_blocks(in_RSI), 0 < IVar10 ||
             ((IVar10 = pnga_total_blocks(in_RCX), 0 < IVar10 ||
              (IVar10 = pnga_total_blocks(in_R8), 0 < IVar10)))))) {
    pnga_inquire(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe88);
    pnga_inquire(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe88);
    pnga_inquire(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe88);
    pnga_add_patch(in_stack_000009e8,in_stack_000009e0,in_stack_000009d8,in_stack_000009d0,
                   in_stack_000009c8,in_stack_000009c0,in_stack_00000a00,in_stack_00000a08,
                   in_stack_00000a10,in_stack_00000a18,in_stack_00000a20);
  }
  else {
    pnga_pgroup_sync(in_stack_fffffffffffffc80);
    pnga_inquire(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                 in_stack_fffffffffffffe88);
    pnga_distribution(lVar11,proc_00,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (0 < local_158[0]) {
      pnga_access_ptr((Integer)ac,(Integer *)x.imag,(Integer *)x.real,(void *)y.imag,
                      (Integer *)y.real);
      local_25c = 0;
      local_58 = (local_198[local_38 + -1] - local_158[local_38 + -1]) + 1;
      for (; (long)local_25c < local_38 + -1; local_25c = local_25c + 1) {
        if (local_118[local_25c] != (local_198[local_25c] - local_158[local_25c]) + 1) {
          pnga_error(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        }
        local_58 = ((local_198[local_25c] - local_158[local_25c]) + 1) * local_58;
      }
    }
    hi = local_88;
    proc = local_58;
    if (in_RSI != in_R8) {
      pnga_inquire(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                   in_stack_fffffffffffffe88);
      if (local_40 != local_48) {
        pnga_error(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      }
      pnga_distribution(lVar11,proc_00,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      hi = in_stack_ffffffffffffff88;
      proc = proc_00;
      if (0 < local_158[0]) {
        pnga_access_ptr((Integer)ac,(Integer *)x.imag,(Integer *)x.real,(void *)y.imag,
                        (Integer *)y.real);
        local_260 = 0;
        proc = (local_198[local_38 + -1] - local_158[local_38 + -1]) + 1;
        for (; hi = in_stack_ffffffffffffff88, (long)local_260 < local_38 + -1;
            local_260 = local_260 + 1) {
          if (local_118[local_260] != (local_198[local_260] - local_158[local_260]) + 1) {
            pnga_error(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          }
          proc = ((local_198[local_260] - local_158[local_260]) + 1) * proc;
        }
      }
    }
    if (in_RCX == in_R8) {
      local_80 = local_88;
      lVar11 = local_58;
    }
    else {
      pnga_inquire(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                   in_stack_fffffffffffffe88);
      if (local_40 != local_48) {
        pnga_error(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      }
      pnga_distribution(lVar11,proc,in_stack_ffffffffffffff90,hi);
      if (0 < local_158[0]) {
        pnga_access_ptr((Integer)ac,(Integer *)x.imag,(Integer *)x.real,(void *)y.imag,
                        (Integer *)y.real);
        local_264 = 0;
        lVar11 = (local_198[local_38 + -1] - local_158[local_38 + -1]) + 1;
        for (; (long)local_264 < local_38 + -1; local_264 = local_264 + 1) {
          if (local_118[local_264] != (local_198[local_264] - local_158[local_264]) + 1) {
            pnga_error(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          }
          lVar11 = ((local_198[local_264] - local_158[local_264]) + 1) * lVar11;
        }
      }
    }
    if (local_58 != lVar11) {
      pnga_error(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    }
    if (local_58 != proc) {
      pnga_error(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    }
    if (0 < local_158[0]) {
      switch(local_40) {
      case 0x3e9:
        for (lVar11 = 0; lVar11 < local_58; lVar11 = lVar11 + 1) {
          *(int *)((long)local_88 + lVar11 * 4) =
               (int)*(float *)in_RDI * *(int *)((long)hi + lVar11 * 4) +
               (int)*(float *)in_RDX * *(int *)((long)local_80 + lVar11 * 4);
        }
        break;
      case 0x3ea:
        for (lVar11 = 0; lVar11 < local_58; lVar11 = lVar11 + 1) {
          local_88[lVar11] = (long)*in_RDI * hi[lVar11] + (long)*in_RDX * local_80[lVar11];
        }
        break;
      case 0x3eb:
        for (lVar11 = 0; lVar11 < local_58; lVar11 = lVar11 + 1) {
          *(float *)((long)local_88 + lVar11 * 4) =
               *(float *)in_RDI * *(float *)((long)hi + lVar11 * 4) +
               *(float *)in_RDX * *(float *)((long)local_80 + lVar11 * 4);
        }
        break;
      case 0x3ec:
        for (lVar11 = 0; lVar11 < local_58; lVar11 = lVar11 + 1) {
          local_88[lVar11] =
               (Integer)(*in_RDI * (double)hi[lVar11] + *in_RDX * (double)local_80[lVar11]);
        }
        break;
      case 0x3ee:
        for (lVar11 = 0; lVar11 < local_58; lVar11 = lVar11 + 1) {
          local_348 = SUB84(*in_RDI,0);
          local_330 = (float)hi[lVar11];
          fStack_344 = (float)((ulong)*in_RDI >> 0x20);
          fStack_32c = (float)((ulong)hi[lVar11] >> 0x20);
          local_350 = SUB84(*in_RDX,0);
          local_338 = (float)local_80[lVar11];
          fStack_34c = (float)((ulong)*in_RDX >> 0x20);
          fStack_334 = (float)((ulong)local_80[lVar11] >> 0x20);
          *(float *)(local_88 + lVar11) =
               -fStack_34c * fStack_334 +
               local_350 * local_338 + local_348 * local_330 + -(fStack_344 * fStack_32c);
          *(float *)((long)local_88 + lVar11 * 8 + 4) =
               fStack_34c * local_338 +
               local_350 * fStack_334 + local_348 * fStack_32c + fStack_344 * local_330;
        }
        break;
      case 0x3ef:
        for (lVar11 = 0; lVar11 < local_58; lVar11 = lVar11 + 1) {
          dVar1 = (double)hi[lVar11 * 2];
          dVar2 = (double)(hi + lVar11 * 2)[1];
          dVar3 = (double)local_80[lVar11 * 2];
          dVar4 = (double)(local_80 + lVar11 * 2)[1];
          dVar5 = *in_RDI;
          dVar6 = in_RDI[1];
          dVar7 = *in_RDX;
          dVar8 = in_RDX[1];
          local_88[lVar11 * 2] =
               (Integer)(-dVar8 * dVar4 + dVar7 * dVar3 + dVar5 * dVar1 + -(dVar6 * dVar2));
          local_88[lVar11 * 2 + 1] =
               (Integer)(dVar8 * dVar3 + dVar7 * dVar4 + dVar5 * dVar2 + dVar6 * dVar1);
        }
        break;
      case 0x3f8:
        for (lVar11 = 0; lVar11 < local_58; lVar11 = lVar11 + 1) {
          local_88[lVar11] = (long)*in_RDI * hi[lVar11] + (long)*in_RDX * local_80[lVar11];
        }
      }
      pnga_release_update(in_R8,local_158,local_198);
      if (in_R8 != in_RSI) {
        pnga_release(in_RSI,local_158,local_198);
      }
      if (in_R8 != in_RCX) {
        pnga_release(in_RCX,local_158,local_198);
      }
    }
    if (local_a8 != 0) {
      pnga_pgroup_sync(in_stack_fffffffffffffc80);
    }
  }
  return;
}

Assistant:

void pnga_add(void *alpha, Integer g_a, void* beta, Integer g_b, Integer g_c)
{
Integer  ndim, type, typeC, me, elems=0, elemsb=0, elemsa=0;
register Integer i;
void *ptr_a, *ptr_b, *ptr_c;
Integer a_grp, b_grp, c_grp;
int local_sync_begin,local_sync_end;
 
 Integer _dims[MAXDIM];
 Integer _ld[MAXDIM-1];
 Integer _lo[MAXDIM];
 Integer _hi[MAXDIM];
 Integer andim, adims[MAXDIM];
 Integer bndim, bdims[MAXDIM];
 Integer cndim, cdims[MAXDIM];
 
   local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/

   a_grp = pnga_get_pgroup(g_a);
   b_grp = pnga_get_pgroup(g_b);
   c_grp = pnga_get_pgroup(g_c);
   if (a_grp != b_grp || b_grp != c_grp)
     pnga_error("All three arrays must be on same group for ga_add",0L);

   if(local_sync_begin)pnga_pgroup_sync(a_grp);

   me = pnga_pgroup_nodeid(a_grp);
   if((pnga_compare_distr(g_a,g_b) == FALSE) ||
      (pnga_compare_distr(g_a,g_c) == FALSE) ||
       pnga_has_ghosts(g_a) || pnga_has_ghosts(g_b) || pnga_has_ghosts(g_c) ||
       pnga_total_blocks(g_a) > 0 || pnga_total_blocks(g_b) > 0 ||
       pnga_total_blocks(g_c) > 0) {
       /* distributions not identical */
       pnga_inquire(g_a, &type, &andim, adims);
       pnga_inquire(g_b, &type, &bndim, bdims);
       pnga_inquire(g_b, &type, &cndim, cdims);

       pnga_add_patch(alpha, g_a, one_arr, adims, beta, g_b, one_arr, bdims,
                      g_c, one_arr, cdims);
       
       return;
   }

   pnga_pgroup_sync(a_grp);
   pnga_inquire(g_c,  &typeC, &ndim, _dims);
   pnga_distribution(g_c, me, _lo, _hi);
   if (  _lo[0]>0 ){
     pnga_access_ptr(g_c, _lo, _hi, &ptr_c, _ld);
     GET_ELEMS(ndim,_lo,_hi,_ld,&elems);
   }

   if(g_a == g_c){
     ptr_a  = ptr_c;
     elemsa = elems;
   }else { 
     pnga_inquire(g_a,  &type, &ndim, _dims);
     if(type != typeC) pnga_error("types not consistent", g_a);
     pnga_distribution(g_a, me, _lo, _hi);
     if (  _lo[0]>0 ){
       pnga_access_ptr(g_a, _lo, _hi, &ptr_a, _ld);
       GET_ELEMS(ndim,_lo,_hi,_ld,&elemsa);
     }
   }

   if(g_b == g_c){
     ptr_b  = ptr_c;
     elemsb = elems;
   }else {
     pnga_inquire(g_b,  &type, &ndim, _dims);
     if(type != typeC) pnga_error("types not consistent", g_b);
     pnga_distribution(g_b, me, _lo, _hi);
     if (  _lo[0]>0 ){
       pnga_access_ptr(g_b, _lo, _hi, &ptr_b, _ld);
       GET_ELEMS(ndim,_lo,_hi,_ld,&elemsb);
     }
   }

   if(elems!= elemsb)pnga_error("inconsistent number of elements a",elems-elemsb);
   if(elems!= elemsa)pnga_error("inconsistent number of elements b",elems-elemsa);

   if (  _lo[0]>0 ){

       /* operation on the "local" piece of data */
       switch(type){
         int *ia, *ib, *ic;
         double *da,*db,*dc;
         float *fa, *fb, *fc;
         long *la,*lb,*lc;
         long long *lla,*llb,*llc;
         case C_DBL:
                  da = (double*)ptr_a;
                  db = (double*)ptr_b;
                  dc = (double*)ptr_c;
                  for(i=0; i<elems; i++)
                      dc[i] = *(double*)alpha *da[i] +
                              *(double*)beta * db[i];
              break;
         case C_DCPL:
                  for(i=0; i<elems; i++){
                     DoubleComplex a = ((DoubleComplex*)ptr_a)[i];
                     DoubleComplex b = ((DoubleComplex*)ptr_b)[i];
                     DoubleComplex *ac = (DoubleComplex*)ptr_c;
                     DoubleComplex x= *(DoubleComplex*)alpha;
                     DoubleComplex y= *(DoubleComplex*)beta;
                     /* c = x*a + y*b */
                     ac[i].real = x.real*a.real - 
                              x.imag*a.imag + y.real*b.real - y.imag*b.imag;
                     ac[i].imag = x.real*a.imag + 
                              x.imag*a.real + y.real*b.imag + y.imag*b.real;
                  }
              break;
         case C_SCPL:
                  for(i=0; i<elems; i++){
                     SingleComplex a = ((SingleComplex*)ptr_a)[i];
                     SingleComplex b = ((SingleComplex*)ptr_b)[i];
                     SingleComplex *ac = (SingleComplex*)ptr_c;
                     SingleComplex x= *(SingleComplex*)alpha;
                     SingleComplex y= *(SingleComplex*)beta;
                     /* c = x*a + y*b */
                     ac[i].real = x.real*a.real - 
                              x.imag*a.imag + y.real*b.real - y.imag*b.imag;
                     ac[i].imag = x.real*a.imag + 
                              x.imag*a.real + y.real*b.imag + y.imag*b.real;
                  }
              break;
         case C_FLOAT:
                  fa = (float*)ptr_a;
                  fb = (float*)ptr_b;
                  fc = (float*)ptr_c;
                  for(i=0; i<elems; i++)
                      fc[i] = *(float*)alpha *fa[i] + *(float*)beta *fb[i]; 
              break;
         case C_INT:
                  ia = (int*)ptr_a;
                  ib = (int*)ptr_b;
                  ic = (int*)ptr_c;
                  for(i=0; i<elems; i++) 
                      ic[i] = *(int*)alpha *ia[i] + *(int*)beta *ib[i];
              break;    
         case C_LONG:
                  la = (long*)ptr_a;
		  lb = (long*)ptr_b;
		  lc = (long*)ptr_c;
                  for(i=0; i<elems; i++)
                      lc[i] = *(long*)alpha *la[i] + *(long*)beta *lb[i];
              break;
         case C_LONGLONG:
                  lla = (long long*)ptr_a;
		  llb = (long long*)ptr_b;
		  llc = (long long*)ptr_c;
                  for(i=0; i<elems; i++)
                      llc[i] = ( *(long long*)alpha *lla[i] +
                                 *(long long*)beta  * llb[i] );
                
       }

       /* release access to the data */
       pnga_release_update(g_c, _lo, _hi);
       if(g_c != g_a)pnga_release(g_a, _lo, _hi);
       if(g_c != g_b)pnga_release(g_b, _lo, _hi);
   }


   if(local_sync_end)pnga_pgroup_sync(a_grp);
}